

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool DnsStats::IsInSortedList(char **list,size_t nb_list,uint8_t *tld,size_t length)

{
  size_t sVar1;
  size_t i_mid;
  size_t i;
  uint8_t target [64];
  ulong uStack_40;
  int c;
  size_t i_high;
  size_t i_low;
  bool is_found;
  size_t length_local;
  uint8_t *tld_local;
  size_t nb_list_local;
  char **list_local;
  
  i_low._7_1_ = false;
  i_high = 0;
  if (length < 0x40) {
    for (i_mid = 0; i_mid < length; i_mid = i_mid + 1) {
      target._60_4_ = ZEXT14(tld[i_mid]);
      if ((0x60 < (uint)target._60_4_) && ((uint)target._60_4_ < 0x7b)) {
        target._60_4_ = target._60_4_ - 0x20;
      }
      target[i_mid - 8] = (uint8_t)target._60_4_;
    }
    target._60_4_ = CompareToUpperCaseString((uint8_t *)&i,length,*list);
    if (target._60_4_ == 0) {
      i_low._7_1_ = true;
    }
    else if ((int)target._60_4_ < 0) {
      i_low._7_1_ = false;
    }
    else {
      target._60_4_ = CompareToUpperCaseString((uint8_t *)&i,length,list[nb_list - 1]);
      if (target._60_4_ == 0) {
        i_low._7_1_ = true;
      }
      else {
        uStack_40 = nb_list - 1;
        sVar1 = i_high;
        if ((int)target._60_4_ < 1) {
          while (i_high = sVar1, i_high + 1 < uStack_40) {
            sVar1 = i_high + uStack_40 >> 1;
            target._60_4_ = CompareToUpperCaseString((uint8_t *)&i,length,list[sVar1]);
            if (target._60_4_ == 0) {
              return true;
            }
            if ((int)target._60_4_ < 0) {
              uStack_40 = sVar1;
              sVar1 = i_high;
            }
          }
        }
        else {
          i_low._7_1_ = false;
        }
      }
    }
  }
  return i_low._7_1_;
}

Assistant:

bool DnsStats::IsInSortedList(const char ** list, size_t nb_list, uint8_t * tld, size_t length)
{
    bool is_found = false;
    size_t i_low = 0;
    size_t i_high = nb_list - 1;
    int c;
    uint8_t target[64];

    if (length < sizeof(target)) {
        for (size_t i = 0; i < length; i++) {
            c = tld[i];
            if (c >= 'a' && c <= 'z') {
                c += 'A' - 'a';
            }
            target[i] = c;
        }

        c = CompareToUpperCaseString(target, length, list[i_low]);
        if (c == 0) {
            is_found = true;
        }
        else if (c < 0) {
            is_found = false;
        }
        else {
            c = CompareToUpperCaseString(target, length, list[i_high]);
            if (c == 0) {
                is_found = true;
            }
            else if (c > 0) {
                is_found = false;
            }
            else {
                while (i_low + 1 < i_high) {
                    size_t i_mid = (i_low + i_high) / 2;
                    c = CompareToUpperCaseString(target, length, list[i_mid]);
                    if (c == 0) {
                        is_found = true;
                        break;
                    }
                    else if (c < 0) {
                        i_high = i_mid;
                    }
                    else {
                        i_low = i_mid;
                    }
                }
            }
        }
    }
    return is_found;
}